

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# topology.hpp
# Opt level: O2

void __thiscall tf::Topology::_carry_out_promise(Topology *this)

{
  exception_ptr e;
  exception_ptr eStack_38;
  exception_ptr local_30;
  exception_ptr local_28;
  
  if ((this->_exception_ptr)._M_exception_object != (void *)0x0) {
    std::__exception_ptr::exception_ptr::exception_ptr(&local_30,&this->_exception_ptr);
    local_28._M_exception_object = (void *)0x0;
    std::__exception_ptr::exception_ptr::operator=(&this->_exception_ptr,&local_28);
    std::__exception_ptr::exception_ptr::~exception_ptr(&local_28);
    std::__exception_ptr::exception_ptr::exception_ptr(&eStack_38,&local_30);
    std::promise<void>::set_exception(&this->_promise,&eStack_38);
    std::__exception_ptr::exception_ptr::~exception_ptr(&eStack_38);
    std::__exception_ptr::exception_ptr::~exception_ptr(&local_30);
    return;
  }
  std::promise<void>::set_value(&this->_promise);
  return;
}

Assistant:

inline void Topology::_carry_out_promise() {
  if(_exception_ptr) {
    auto e = _exception_ptr;
    _exception_ptr = nullptr;
    _promise.set_exception(e);
  }
  else {
    _promise.set_value();
  }
}